

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

void __thiscall JSONRPCRequest::parse(JSONRPCRequest *this,UniValue *valRequest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  VType VVar3;
  string_view source_file;
  bool bVar4;
  bool bVar5;
  int iVar6;
  UniValue *pUVar7;
  UniValue *pUVar8;
  string *psVar9;
  Logger *pLVar10;
  JSONRPCVersion JVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view str;
  string_view str_00;
  string_view key_02;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  undefined7 uStack_13f;
  string log_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<UniValue,_std::allocator<UniValue>_> vStack_f0;
  string local_d8 [4];
  size_t i;
  pointer pUStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (valRequest->typ != VOBJ) {
    pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"Invalid Request object","");
    JSONRPCError(pUVar7,-0x7f58,&log_msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_00153676;
  }
  pUVar7 = UniValue::get_obj(valRequest);
  paVar1 = &log_msg.field_2;
  log_msg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"id","");
  bVar4 = UniValue::findKey(pUVar7,&log_msg,&i);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log_msg._M_dataplus._M_p != paVar1) {
    operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    key._M_str = "id";
    key._M_len = 2;
    pUVar8 = UniValue::find_value(pUVar7,key);
    std::optional<UniValue>::operator=(&this->id,pUVar8);
  }
  else if ((this->id).super__Optional_base<UniValue,_false,_false>._M_payload.
           super__Optional_payload<UniValue,_true,_false,_false>.
           super__Optional_payload_base<UniValue>._M_engaged == true) {
    std::_Optional_payload_base<UniValue>::_M_destroy((_Optional_payload_base<UniValue> *)this);
  }
  this->m_json_version = V1_LEGACY;
  key_00._M_str = "jsonrpc";
  key_00._M_len = 7;
  pUVar8 = UniValue::find_value(pUVar7,key_00);
  if (pUVar8->typ != VNULL) {
    if (pUVar8->typ != VSTR) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      log_msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&log_msg,"jsonrpc field must be a string","");
      JSONRPCError(pUVar7,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00153676;
    }
    psVar9 = UniValue::get_str_abi_cxx11_(pUVar8);
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (psVar9,"1.0");
    if (iVar6 == 0) {
      JVar11 = V1_LEGACY;
    }
    else {
      psVar9 = UniValue::get_str_abi_cxx11_(pUVar8);
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(psVar9,"2.0");
      JVar11 = V2;
      if (iVar6 != 0) {
        pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
        log_msg._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&log_msg,"JSON-RPC version not supported","");
        JSONRPCError(pUVar7,-0x7f58,&log_msg);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00153676;
      }
    }
    this->m_json_version = JVar11;
  }
  key_01._M_str = "method";
  key_01._M_len = 6;
  pUVar8 = UniValue::find_value(pUVar7,key_01);
  if (pUVar8->typ != VSTR) {
    if (pUVar8->typ == VNULL) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      log_msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"Missing method","");
      JSONRPCError(pUVar7,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      log_msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&log_msg,"Method must be a string","");
      JSONRPCError(pUVar7,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    goto LAB_00153676;
  }
  psVar9 = UniValue::get_str_abi_cxx11_(pUVar8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->strMethod,psVar9);
  bVar4 = fLogIPs;
  pLVar10 = LogInstance();
  bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar10,RPC,Debug);
  if (bVar4 == true) {
    if (bVar5) {
      str._M_str = (this->strMethod)._M_dataplus._M_p;
      str._M_len = (this->strMethod)._M_string_length;
      SanitizeString_abi_cxx11_(local_d8,str,0);
      pLVar10 = LogInstance();
      bVar4 = BCLog::Logger::Enabled(pLVar10);
      if (bVar4) {
        log_msg._M_string_length = 0;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        log_msg._M_dataplus._M_p = (pointer)paVar1;
        tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  ((string *)&i,(tinyformat *)"ThreadRPCServer method=%s user=%s peeraddr=%s\n",
                   (char *)local_d8,&this->authUser,&this->peerAddr,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)i != &local_48) {
          operator_delete((void *)i,(ulong)(local_48._M_allocated_capacity + 1));
        }
        pLVar10 = LogInstance();
        i = 0x58;
        pUStack_50 = (pointer)0x1ae8c7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp"
        ;
        source_file._M_len = 0x58;
        str_01._M_str = log_msg._M_dataplus._M_p;
        str_01._M_len = log_msg._M_string_length;
        logging_function._M_str = "parse";
        logging_function._M_len = 5;
        BCLog::Logger::LogPrintStr(pLVar10,str_01,logging_function,source_file,0xe6,RPC,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg._M_dataplus._M_p != paVar1) {
          operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
LAB_00152d01:
        operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._0_8_ + 1);
      }
    }
  }
  else if (bVar5) {
    str_00._M_str = (this->strMethod)._M_dataplus._M_p;
    str_00._M_len = (this->strMethod)._M_string_length;
    SanitizeString_abi_cxx11_(&log_msg,str_00,0);
    logging_function_00._M_str = "parse";
    logging_function_00._M_len = 5;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_00._M_len = 0x58;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function_00,source_file_00,0xe8,RPC,Debug,
               "ThreadRPCServer method=%s user=%s\n",&log_msg,&this->authUser);
    local_d8[0].field_2._M_allocated_capacity = log_msg.field_2._M_allocated_capacity;
    local_d8[0]._M_dataplus = log_msg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)log_msg._M_dataplus._M_p != paVar1) goto LAB_00152d01;
  }
  key_02._M_str = "params";
  key_02._M_len = 6;
  pUVar7 = UniValue::find_value(pUVar7,key_02);
  VVar3 = pUVar7->typ;
  if (VVar3 - VOBJ < 2) {
    (this->params).typ = VVar3;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(this->params).val,&pUVar7->val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->params).keys,&pUVar7->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::operator=
              (&(this->params).values,&pUVar7->values);
  }
  else {
    if (VVar3 != VNULL) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      log_msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&log_msg,"Params must be an array or object","");
      JSONRPCError(pUVar7,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00153676;
    }
    log_msg._M_dataplus._M_p._0_4_ = 2;
    puVar2 = (undefined1 *)((long)&log_msg.field_2 + 8);
    log_msg.field_2._M_local_buf[8] = '\0';
    log_msg.field_2._9_7_ = uStack_13f;
    log_msg.field_2._M_allocated_capacity = 0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->params).typ = VARR;
    log_msg._M_string_length = (size_type)puVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(this->params).val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &log_msg._M_string_length);
    i = (size_t)(this->params).keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pUStack_50 = (pointer)(this->params).keys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_allocated_capacity =
         (size_type)
         (this->params).keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->params).keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_108.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->params).keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_108.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->params).keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_108.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    i = (size_t)(this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                _M_impl.super__Vector_impl_data._M_start;
    pUStack_50 = (this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_48._M_allocated_capacity =
         (size_type)
         (this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->params).values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_f0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&i);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    if ((undefined1 *)log_msg._M_string_length != puVar2) {
      operator_delete((void *)log_msg._M_string_length,
                      CONCAT71(log_msg.field_2._9_7_,log_msg.field_2._M_local_buf[8]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00153676:
  __stack_chk_fail();
}

Assistant:

void JSONRPCRequest::parse(const UniValue& valRequest)
{
    // Parse request
    if (!valRequest.isObject())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Invalid Request object");
    const UniValue& request = valRequest.get_obj();

    // Parse id now so errors from here on will have the id
    if (request.exists("id")) {
        id = request.find_value("id");
    } else {
        id = std::nullopt;
    }

    // Check for JSON-RPC 2.0 (default 1.1)
    m_json_version = JSONRPCVersion::V1_LEGACY;
    const UniValue& jsonrpc_version = request.find_value("jsonrpc");
    if (!jsonrpc_version.isNull()) {
        if (!jsonrpc_version.isStr()) {
            throw JSONRPCError(RPC_INVALID_REQUEST, "jsonrpc field must be a string");
        }
        // The "jsonrpc" key was added in the 2.0 spec, but some older documentation
        // incorrectly included {"jsonrpc":"1.0"} in a request object, so we
        // maintain that for backwards compatibility.
        if (jsonrpc_version.get_str() == "1.0") {
            m_json_version = JSONRPCVersion::V1_LEGACY;
        } else if (jsonrpc_version.get_str() == "2.0") {
            m_json_version = JSONRPCVersion::V2;
        } else {
            throw JSONRPCError(RPC_INVALID_REQUEST, "JSON-RPC version not supported");
        }
    }

    // Parse method
    const UniValue& valMethod{request.find_value("method")};
    if (valMethod.isNull())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Missing method");
    if (!valMethod.isStr())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Method must be a string");
    strMethod = valMethod.get_str();
    if (fLogIPs)
        LogDebug(BCLog::RPC, "ThreadRPCServer method=%s user=%s peeraddr=%s\n", SanitizeString(strMethod),
            this->authUser, this->peerAddr);
    else
        LogDebug(BCLog::RPC, "ThreadRPCServer method=%s user=%s\n", SanitizeString(strMethod), this->authUser);

    // Parse params
    const UniValue& valParams{request.find_value("params")};
    if (valParams.isArray() || valParams.isObject())
        params = valParams;
    else if (valParams.isNull())
        params = UniValue(UniValue::VARR);
    else
        throw JSONRPCError(RPC_INVALID_REQUEST, "Params must be an array or object");
}